

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiWindow * ImGui::FindBottomMostVisibleWindowWithinBeginStack(ImGuiWindow *parent_window)

{
  uint uVar1;
  ImGuiWindow *window;
  ImGuiContext *pIVar2;
  bool bVar3;
  uint uVar4;
  ImGuiWindow *in_RAX;
  ImGuiWindow *pIVar5;
  
  pIVar2 = GImGui;
  uVar4 = FindWindowDisplayIndex(in_RAX);
  pIVar5 = parent_window;
  do {
    if ((int)uVar4 < 0) {
      return pIVar5;
    }
    window = (pIVar2->Windows).Data[uVar4];
    uVar1 = window->Flags;
    if ((uVar1 >> 0x18 & 1) == 0) {
      bVar3 = IsWindowWithinBeginStackOf(window,parent_window);
      if (!bVar3) {
        return pIVar5;
      }
      if (((window->Active == true) && (window->Hidden == false)) &&
         ((uVar1 >> 0x19 & 1) <= (uint)(((uint)parent_window->Flags >> 0x19 & 1) != 0))) {
        pIVar5 = window;
      }
    }
    uVar4 = uVar4 - 1;
  } while( true );
}

Assistant:

ImGuiWindow* ImGui::FindBottomMostVisibleWindowWithinBeginStack(ImGuiWindow* parent_window)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* bottom_most_visible_window = parent_window;
    for (int i = FindWindowDisplayIndex(parent_window); i >= 0; i--)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_ChildWindow)
            continue;
        if (!IsWindowWithinBeginStackOf(window, parent_window))
            break;
        if (IsWindowActiveAndVisible(window) && GetWindowDisplayLayer(window) <= GetWindowDisplayLayer(parent_window))
            bottom_most_visible_window = window;
    }
    return bottom_most_visible_window;
}